

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O3

int __thiscall io::detail::AsynchronousReader::init(AsynchronousReader *this,EVP_PKEY_CTX *ctx)

{
  _Head_base<0UL,_io::ByteSourceBase_*,_false> _Var1;
  _Head_base<0UL,_io::ByteSourceBase_*,_false> _Var2;
  int extraout_EAX;
  anon_class_8_1_8991fb9c_for__M_head_impl local_40;
  undefined1 local_38 [8];
  unique_lock<std::mutex> guard;
  
  local_38 = (undefined1  [8])&this->lock;
  guard._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_38);
  guard._M_device._0_1_ = 1;
  _Var1._M_head_impl = *(ByteSourceBase **)ctx;
  *(undefined8 *)ctx = 0;
  _Var2._M_head_impl =
       (this->byte_source)._M_t.
       super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
       super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
       super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl;
  (this->byte_source)._M_t.
  super___uniq_ptr_impl<io::ByteSourceBase,_std::default_delete<io::ByteSourceBase>_>._M_t.
  super__Tuple_impl<0UL,_io::ByteSourceBase_*,_std::default_delete<io::ByteSourceBase>_>.
  super__Head_base<0UL,_io::ByteSourceBase_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (ByteSourceBase *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_ByteSourceBase[2])();
  }
  this->desired_byte_count = -1;
  this->termination_requested = false;
  local_40.this = this;
  std::thread::
  thread<io::detail::AsynchronousReader::init(std::unique_ptr<io::ByteSourceBase,std::default_delete<io::ByteSourceBase>>)::_lambda()_1_,,void>
            ((thread *)&guard._M_owns,&local_40);
  if ((this->worker)._M_id._M_thread == 0) {
    (this->worker)._M_id._M_thread = guard._8_8_;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
    return extraout_EAX;
  }
  std::terminate();
}

Assistant:

void init(std::unique_ptr<ByteSourceBase>arg_byte_source){
                                std::unique_lock<std::mutex>guard(lock);
                                byte_source = std::move(arg_byte_source);
                                desired_byte_count = -1;
                                termination_requested = false;
                                worker = std::thread(
                                        [&]{
                                                std::unique_lock<std::mutex>guard(lock);
                                                try{
                                                        for(;;){
                                                                read_requested_condition.wait(
                                                                        guard, 
                                                                        [&]{
                                                                                return desired_byte_count != -1 || termination_requested;
                                                                        }
                                                                );
                                                                if(termination_requested)
                                                                        return;

                                                                read_byte_count = byte_source->read(buffer, desired_byte_count);
                                                                desired_byte_count = -1;
                                                                if(read_byte_count == 0)
                                                                        break;
                                                                read_finished_condition.notify_one();
                                                        }
                                                }catch(...){
                                                        read_error = std::current_exception();
                                                }
                                                read_finished_condition.notify_one();
                                        }
                                );
                        }